

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampSamplerParameterIWithWrongPname.cpp
# Opt level: O2

void __thiscall
glcts::TextureBorderClampSamplerParameterIWithWrongPnameTest::deinit
          (TextureBorderClampSamplerParameterIWithWrongPnameTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  
  iVar1 = (*((this->super_TextureBorderClampBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xa8))(0,0);
  if (this->m_sampler_id != 0) {
    (**(code **)(CONCAT44(extraout_var,iVar1) + 0x468))(1,&this->m_sampler_id);
    this->m_sampler_id = 0;
  }
  TestCaseBase::deinit((TestCaseBase *)this);
  return;
}

Assistant:

void TextureBorderClampSamplerParameterIWithWrongPnameTest::deinit(void)
{
	/* Retrieve ES entry-points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Bind the default sampler object */
	gl.bindSampler(m_texture_unit_index, 0);

	/* Delete a sampler object, if one was created during test execution */
	if (0 != m_sampler_id)
	{
		gl.deleteSamplers(1, &m_sampler_id);

		m_sampler_id = 0;
	}

	/* Deinitialize base class instance */
	TestCaseBase::deinit();
}